

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool accountingDiffTolerated
                   (XML_Parser originParser,int tok,char *before,char *after,int source_line,
                   XML_Account account)

{
  ulong uVar1;
  XmlBigCount XVar2;
  XmlBigCount XVar3;
  XML_Parser pXVar4;
  XML_Parser rootParser;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  float fVar10;
  
  if (tok + 4U < 5) {
    if ((account != XML_ACCOUNT_NONE & (0x1dU >> ((byte)(tok + 4U) & 0x1f) ^ 1)) == 0) {
      return '\x01';
    }
  }
  else if (account == XML_ACCOUNT_NONE) {
    return '\x01';
  }
  uVar8 = 0xffffffff;
  pXVar4 = originParser;
  do {
    rootParser = pXVar4;
    uVar8 = uVar8 + 1;
    pXVar4 = rootParser->m_parentParser;
  } while (rootParser->m_parentParser != (XML_Parser)0x0);
  uVar7 = (long)after - (long)before;
  lVar5 = 0x3b8;
  if (account == XML_ACCOUNT_DIRECT) {
    lVar5 = (ulong)(rootParser != originParser) * 8 + 0x3b0;
  }
  uVar1 = *(ulong *)((long)&rootParser->m_userData + lVar5);
  if (CARRY8(uVar1,uVar7)) {
    bVar9 = false;
  }
  else {
    *(ulong *)((long)&rootParser->m_userData + lVar5) = uVar1 + uVar7;
    XVar2 = (rootParser->m_accounting).countBytesIndirect;
    XVar3 = (rootParser->m_accounting).countBytesDirect;
    fVar10 = accountingGetCurrentAmplification(rootParser);
    bVar9 = true;
    if ((rootParser->m_accounting).activationThresholdBytes <= XVar2 + XVar3) {
      bVar9 = fVar10 <= (rootParser->m_accounting).maximumAmplificationFactor;
    }
    if (1 < (rootParser->m_accounting).debugLevel) {
      accountingReportStats(rootParser,(char *)"");
      if (rootParser->m_parentParser != (XML_Parser)0x0) {
        __assert_fail("! rootParser->m_parentParser",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                      ,0x1eb8,
                      "void accountingReportDiff(XML_Parser, unsigned int, const char *, const char *, ptrdiff_t, int, enum XML_Account)"
                     );
      }
      pcVar6 = "EXP";
      if (account == XML_ACCOUNT_DIRECT) {
        pcVar6 = "DIR";
      }
      fprintf(_stderr," (+%6ld bytes %s|%u, xmlparse.c:%d) %*s\"",uVar7,pcVar6,(ulong)uVar8,
              (ulong)(uint)source_line,10,"");
      if (((long)uVar7 < 0x19) || (2 < (rootParser->m_accounting).debugLevel)) {
        if (before < after) {
          accountingDiffTolerated_cold_2();
        }
      }
      else {
        accountingDiffTolerated_cold_1();
      }
      fwrite("\"\n",2,1,_stderr);
    }
  }
  return bVar9;
}

Assistant:

static XML_Bool
accountingDiffTolerated(XML_Parser originParser, int tok, const char *before,
                        const char *after, int source_line,
                        enum XML_Account account) {
  /* Note: We need to check the token type *first* to be sure that
   *       we can even access variable <after>, safely.
   *       E.g. for XML_TOK_NONE <after> may hold an invalid pointer. */
  switch (tok) {
  case XML_TOK_INVALID:
  case XML_TOK_PARTIAL:
  case XML_TOK_PARTIAL_CHAR:
  case XML_TOK_NONE:
    return XML_TRUE;
  }

  if (account == XML_ACCOUNT_NONE)
    return XML_TRUE; /* because these bytes have been accounted for, already */

  unsigned int levelsAwayFromRootParser;
  const XML_Parser rootParser
      = getRootParserOf(originParser, &levelsAwayFromRootParser);
  assert(! rootParser->m_parentParser);

  const int isDirect
      = (account == XML_ACCOUNT_DIRECT) && (originParser == rootParser);
  const ptrdiff_t bytesMore = after - before;

  XmlBigCount *const additionTarget
      = isDirect ? &rootParser->m_accounting.countBytesDirect
                 : &rootParser->m_accounting.countBytesIndirect;

  /* Detect and avoid integer overflow */
  if (*additionTarget > (XmlBigCount)(-1) - (XmlBigCount)bytesMore)
    return XML_FALSE;
  *additionTarget += bytesMore;

  const XmlBigCount countBytesOutput
      = rootParser->m_accounting.countBytesDirect
        + rootParser->m_accounting.countBytesIndirect;
  const float amplificationFactor
      = accountingGetCurrentAmplification(rootParser);
  const XML_Bool tolerated
      = (countBytesOutput < rootParser->m_accounting.activationThresholdBytes)
        || (amplificationFactor
            <= rootParser->m_accounting.maximumAmplificationFactor);

  if (rootParser->m_accounting.debugLevel >= 2u) {
    accountingReportStats(rootParser, "");
    accountingReportDiff(rootParser, levelsAwayFromRootParser, before, after,
                         bytesMore, source_line, account);
  }

  return tolerated;
}